

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactor<double>::vSolveUright
          (CLUFactor<double> *this,double *vec,int *vidx,double *rhs,int *ridx,int rn,double eps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  pointer pdVar8;
  int *piVar9;
  int *piVar10;
  pointer pdVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int *piVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  double *pdVar26;
  double dVar27;
  double dVar28;
  
  if (rn < 1) {
    iVar13 = 0;
  }
  else {
    piVar4 = (this->row).orig;
    piVar5 = (this->row).perm;
    piVar6 = (this->col).orig;
    piVar7 = (this->u).col.idx;
    pdVar8 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->u).col.len;
    piVar10 = (this->u).col.start;
    pdVar11 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar13 = 0;
    do {
      iVar1 = *ridx;
      uVar19 = rn - 1;
      uVar18 = (ulong)uVar19;
      iVar2 = ridx[uVar18];
      iVar24 = 1;
      iVar25 = 0;
      if (3 < (uint)rn) {
        iVar25 = 0;
        do {
          iVar3 = ridx[iVar24];
          iVar17 = ridx[(long)iVar24 + 1];
          if (iVar17 < iVar3) {
            iVar23 = iVar24;
            iVar17 = iVar3;
            if (iVar3 <= iVar2) goto LAB_0020427e;
          }
          else {
            if (iVar17 <= iVar2) goto LAB_0020427e;
            iVar23 = iVar24 + 1;
          }
          ridx[iVar25] = iVar17;
          iVar24 = iVar23 * 2 + 1;
          iVar25 = iVar23;
        } while (iVar24 < (int)(rn - 2U));
      }
      if ((iVar24 < (int)uVar19) && (iVar2 < ridx[iVar24])) {
        ridx[iVar25] = ridx[iVar24];
        iVar25 = iVar24;
      }
LAB_0020427e:
      ridx[iVar25] = iVar2;
      iVar2 = piVar4[iVar1];
      dVar27 = pdVar11[iVar2] * rhs[iVar2];
      rhs[iVar2] = 0.0;
      rn = uVar19;
      if (eps < ABS(dVar27)) {
        iVar2 = piVar6[iVar1];
        vidx[iVar13] = iVar2;
        vec[iVar2] = dVar27;
        iVar25 = piVar9[iVar2];
        if (0 < iVar25) {
          iVar2 = piVar10[iVar2];
          piVar22 = piVar7 + iVar2;
          pdVar26 = pdVar8 + iVar2;
          do {
            uVar19 = (uint)uVar18;
            iVar2 = *piVar22;
            dVar28 = rhs[iVar2];
            if ((dVar28 != 0.0) || (NAN(dVar28))) {
              dVar28 = dVar28 - *pdVar26 * dVar27;
              rhs[iVar2] = (double)(-(ulong)(dVar28 == 0.0) & 0x2b2bff2ee48e0530) + dVar28;
            }
            else {
              dVar28 = *pdVar26 * -dVar27;
              if (eps < ABS(dVar28)) {
                rhs[iVar2] = dVar28;
                iVar2 = piVar5[iVar2];
                uVar15 = uVar19;
                if (0 < (int)uVar19) {
                  do {
                    uVar20 = (uint)uVar18 - 1;
                    uVar14 = uVar20 >> 1;
                    uVar15 = (uint)uVar18;
                    if (iVar2 <= ridx[uVar14]) break;
                    ridx[uVar18] = ridx[uVar14];
                    uVar18 = (ulong)uVar14;
                    uVar15 = uVar14;
                  } while (1 < uVar20);
                }
                uVar18 = (ulong)(uVar19 + 1);
                ridx[(int)uVar15] = iVar2;
              }
            }
            rn = (int)uVar18;
            piVar22 = piVar22 + 1;
            pdVar26 = pdVar26 + 1;
            bVar12 = 1 < iVar25;
            iVar25 = iVar25 + -1;
          } while (bVar12);
        }
        iVar13 = iVar13 + 1;
        if ((double)iVar1 * 0.2 < (double)rn) {
          lVar21 = (long)*ridx;
          if ((long)*ridx < 0) {
            return iVar13;
          }
          do {
            iVar1 = piVar4[lVar21];
            dVar27 = pdVar11[iVar1] * rhs[iVar1];
            rhs[iVar1] = 0.0;
            if (eps < ABS(dVar27)) {
              iVar1 = piVar6[lVar21];
              lVar16 = (long)iVar13;
              iVar13 = iVar13 + 1;
              vidx[lVar16] = iVar1;
              vec[iVar1] = dVar27;
              iVar2 = piVar9[iVar1];
              if (0 < iVar2) {
                lVar16 = (long)piVar10[iVar1] << 2;
                uVar19 = iVar2 + 1;
                do {
                  iVar1 = *(int *)((long)piVar7 + lVar16);
                  rhs[iVar1] = rhs[iVar1] - *(double *)((long)pdVar8 + lVar16 * 2) * dVar27;
                  lVar16 = lVar16 + 4;
                  uVar19 = uVar19 - 1;
                } while (1 < uVar19);
              }
            }
            bVar12 = 0 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar12);
          return iVar13;
        }
      }
    } while (0 < rn);
  }
  return iVar13;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}